

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O2

void __thiscall muduo::FileUtil::AppendFile::append(AppendFile *this,char *logline,size_t len)

{
  FILE *__stream;
  int savedErrno;
  ssize_t sVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t in_RCX;
  
  sVar1 = write(this,(int)logline,(void *)len,in_RCX);
  do {
    if ((void *)(len - sVar1) == (void *)0x0) goto LAB_0011b04b;
    sVar2 = write(this,(int)logline + (int)sVar1,(void *)(len - sVar1),in_RCX);
    sVar1 = sVar1 + sVar2;
  } while (sVar2 != 0);
  savedErrno = ferror((FILE *)this->fp_);
  __stream = _stderr;
  if (savedErrno != 0) {
    pcVar3 = strerror_tl(savedErrno);
    fprintf(__stream,"AppendFile::append() failed %s\n",pcVar3);
  }
LAB_0011b04b:
  this->writtenBytes_ = this->writtenBytes_ + len;
  return;
}

Assistant:

void FileUtil::AppendFile::append(const char* logline, const size_t len)
{
  size_t n = write(logline, len);
  size_t remain = len - n;
  while (remain > 0)
  {
    size_t x = write(logline + n, remain);
    if (x == 0)
    {
      int err = ferror(fp_);
      if (err)
      {
        fprintf(stderr, "AppendFile::append() failed %s\n", strerror_tl(err));
      }
      break;
    }
    n += x;
    remain = len - n; // remain -= x
  }

  writtenBytes_ += len;
}